

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UBool uhash_compareUnicodeString_63(UElement key1,UElement key2)

{
  ushort uVar1;
  short sVar2;
  byte bVar3;
  UBool UVar4;
  int len;
  UnicodeString *str2;
  UnicodeString *str1;
  int iVar5;
  
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (key2.pointer == (void *)0x0 || key1.pointer == (void *)0x0) {
    return '\0';
  }
  uVar1 = *(ushort *)((long)key1.pointer + 8);
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      len = *(int *)((long)key1.pointer + 0xc);
    }
    else {
      len = (int)(short)uVar1 >> 5;
    }
    sVar2 = *(short *)((long)key2.pointer + 8);
    if (sVar2 < 0) {
      iVar5 = *(int *)((long)key2.pointer + 0xc);
    }
    else {
      iVar5 = (int)sVar2 >> 5;
    }
    bVar3 = 0;
    if ((((int)sVar2 & 1U) == 0) && (len == iVar5)) {
      UVar4 = icu_63::UnicodeString::doEquals
                        ((UnicodeString *)key1.pointer,(UnicodeString *)key2.pointer,len);
      return UVar4 != '\0';
    }
  }
  else {
    bVar3 = *(byte *)((long)key2.pointer + 8) & 1;
  }
  return bVar3;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareUnicodeString(const UElement key1, const UElement key2) {
    const UnicodeString *str1 = (const UnicodeString*) key1.pointer;
    const UnicodeString *str2 = (const UnicodeString*) key2.pointer;
    if (str1 == str2) {
        return TRUE;
    }
    if (str1 == NULL || str2 == NULL) {
        return FALSE;
    }
    return *str1 == *str2;
}